

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O2

void __thiscall
crnlib::dxt1_endpoint_optimizer::compute_pca
          (dxt1_endpoint_optimizer *this,vec3F *axis,vec3F_array *norm_colors,vec3F *def)

{
  float fVar1;
  undefined1 auVar2 [16];
  double dVar3;
  uint uVar4;
  uint uVar5;
  float *pfVar6;
  ulong uVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  float fVar15;
  float fVar17;
  double dVar16;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  
  pfVar6 = norm_colors->m_p->m_s + 1;
  dVar9 = 0.0;
  dVar10 = 0.0;
  dVar11 = 0.0;
  dVar12 = 0.0;
  dVar13 = 0.0;
  dVar14 = 0.0;
  for (uVar7 = 0; norm_colors->m_size != uVar7; uVar7 = uVar7 + 1) {
    fVar1 = ((vec<3U,_float> *)(pfVar6 + -1))->m_s[0];
    uVar4 = (this->m_unique_colors).m_p[uVar7].m_weight;
    fVar15 = (float)*(undefined8 *)pfVar6;
    fVar17 = (float)((ulong)*(undefined8 *)pfVar6 >> 0x20);
    if (uVar4 < 2) {
      dVar18 = (double)(fVar1 * fVar1);
      dVar19 = (double)(fVar1 * fVar15);
      dVar20 = (double)(fVar1 * fVar17);
      dVar21 = (double)(fVar15 * fVar17);
      dVar16 = (double)(fVar15 * fVar15);
      dVar22 = (double)(fVar17 * fVar17);
    }
    else {
      dVar22 = (double)uVar4;
      dVar18 = (double)(fVar1 * fVar1) * dVar22;
      dVar19 = (double)(fVar1 * fVar15) * dVar22;
      dVar20 = (double)(fVar1 * fVar17) * dVar22;
      dVar21 = (double)(fVar15 * fVar17) * dVar22;
      dVar16 = (double)(fVar15 * fVar15) * dVar22;
      dVar22 = (double)(fVar17 * fVar17) * dVar22;
    }
    dVar9 = dVar9 + dVar18;
    dVar10 = dVar10 + dVar19;
    dVar11 = dVar11 + dVar20;
    dVar12 = dVar12 + dVar21;
    dVar13 = dVar13 + dVar16;
    dVar14 = dVar14 + dVar22;
    pfVar6 = pfVar6 + 3;
  }
  dVar16 = 0.699999988079071;
  auVar24 = _DAT_001952f0;
  uVar4 = 0;
  do {
    dVar22 = dVar16;
    dVar18 = auVar24._0_8_;
    dVar19 = auVar24._8_8_;
    dVar16 = dVar22;
    if (uVar4 == 8) break;
    dVar21 = dVar22 * dVar11 + dVar19 * dVar10 + dVar18 * dVar9;
    dVar25 = dVar22 * dVar12 + dVar19 * dVar13 + dVar18 * dVar10;
    dVar16 = dVar14 * dVar22 + dVar12 * dVar19 + dVar11 * dVar18;
    dVar20 = ABS(dVar21);
    if (ABS(dVar21) <= ABS(dVar25)) {
      dVar20 = ABS(dVar25);
    }
    if (dVar20 <= ABS(dVar16)) {
      dVar20 = ABS(dVar16);
    }
    dVar3 = 1.0 / dVar20;
    if (1e-10 < dVar20) {
      dVar16 = dVar16 * dVar3;
    }
    uVar5 = (uint)(1e-10 < dVar20);
    auVar23._0_8_ = CONCAT44((int)(uVar5 << 0x1f) >> 0x1f,(int)(uVar5 << 0x1f) >> 0x1f);
    auVar23._8_4_ = (int)(uVar5 << 0x1f) >> 0x1f;
    auVar23._12_4_ = (int)(uVar5 << 0x1f) >> 0x1f;
    uVar7 = (ulong)(dVar3 * dVar25) & auVar23._8_8_;
    auVar24._0_8_ = ~auVar23._0_8_ & (ulong)dVar21;
    auVar24._8_8_ = ~auVar23._8_8_ & (ulong)dVar25;
    auVar2._8_4_ = (int)uVar7;
    auVar2._0_8_ = (ulong)(dVar3 * dVar21) & auVar23._0_8_;
    auVar2._12_4_ = (int)(uVar7 >> 0x20);
    auVar24 = auVar24 | auVar2;
    uVar5 = uVar4 + 1;
    bVar8 = uVar4 < 3;
    uVar4 = uVar5;
  } while ((bVar8) ||
          (dVar18 = dVar18 - auVar24._0_8_, dVar19 = dVar19 - auVar24._8_8_,
          1e-08 <= (dVar22 - dVar16) * (dVar22 - dVar16) + dVar19 * dVar19 + dVar18 * dVar18));
  dVar10 = auVar24._0_8_;
  dVar11 = auVar24._8_8_;
  dVar9 = dVar16 * dVar16 + dVar11 * dVar11 + dVar10 * dVar10;
  if (1e-10 <= dVar9) {
    dVar9 = 1.0 / SQRT(dVar9);
    *(ulong *)axis->m_s = CONCAT44((float)(dVar11 * dVar9),(float)(dVar10 * dVar9));
    axis->m_s[2] = (float)(dVar16 * dVar9);
    return;
  }
  vec<3U,_float>::operator=(axis,def);
  return;
}

Assistant:

void dxt1_endpoint_optimizer::compute_pca(vec3F& axis, const vec3F_array& norm_colors, const vec3F& def) {
  double cov[6] = {0, 0, 0, 0, 0, 0};
  for (uint i = 0; i < norm_colors.size(); i++) {
    const vec3F& v = norm_colors[i];
    float r = v[0];
    float g = v[1];
    float b = v[2];
    if (m_unique_colors[i].m_weight > 1) {
      const double weight = m_unique_colors[i].m_weight;
      cov[0] += r * r * weight;
      cov[1] += r * g * weight;
      cov[2] += r * b * weight;
      cov[3] += g * g * weight;
      cov[4] += g * b * weight;
      cov[5] += b * b * weight;
    } else {
      cov[0] += r * r;
      cov[1] += r * g;
      cov[2] += r * b;
      cov[3] += g * g;
      cov[4] += g * b;
      cov[5] += b * b;
    }
  }
  double vfr = .9f;
  double vfg = 1.0f;
  double vfb = .7f;
  for (uint iter = 0; iter < 8; iter++) {
    double r = vfr * cov[0] + vfg * cov[1] + vfb * cov[2];
    double g = vfr * cov[1] + vfg * cov[3] + vfb * cov[4];
    double b = vfr * cov[2] + vfg * cov[4] + vfb * cov[5];
    double m = math::maximum(fabs(r), fabs(g), fabs(b));
    if (m > 1e-10) {
      m = 1.0f / m;
      r *= m;
      g *= m;
      b *= m;
    }
    double delta = math::square(vfr - r) + math::square(vfg - g) + math::square(vfb - b);
    vfr = r;
    vfg = g;
    vfb = b;
    if ((iter > 2) && (delta < 1e-8))
      break;
  }
  double len = vfr * vfr + vfg * vfg + vfb * vfb;
  if (len < 1e-10) {
    axis = def;
  } else {
    len = 1.0f / sqrt(len);
    axis.set(static_cast<float>(vfr * len), static_cast<float>(vfg * len), static_cast<float>(vfb * len));
  }
}